

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O2

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  byte *pbVar1;
  handle hVar2;
  object oVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  PyObject *pPVar7;
  size_t sVar8;
  void *__dest;
  internals *piVar9;
  long lVar10;
  handle value;
  PyTypeObject *pPVar11;
  object *object;
  object module;
  tuple bases;
  object ht_qualname;
  object name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> full_name;
  handle local_110;
  handle local_108;
  allocator local_f9;
  object local_f8;
  handle local_f0;
  undefined1 local_e8 [32];
  undefined1 local_c8 [24];
  object local_b0;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_f8.super_handle.m_ptr = (handle)PyUnicode_FromString(rec->name);
  if (local_f8.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_f8.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_f8.super_handle.m_ptr)->ob_refcnt + 1;
  }
  hVar2.m_ptr = (rec->scope).m_ptr;
  local_f0.m_ptr = (PyObject *)local_f8.super_handle.m_ptr;
  if (hVar2.m_ptr == (PyObject *)0x0) {
    local_110.m_ptr = (PyObject *)0x0;
  }
  else {
    bVar4 = hasattr(hVar2,"__qualname__");
    if (bVar4) {
      local_c8._8_8_ = (rec->scope).m_ptr;
      local_c8._16_8_ = "__qualname__";
      local_b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      pPVar7 = accessor<pybind11::detail::accessor_policies::str_attr>::ptr
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_c8);
      local_e8._0_8_ = PyUnicode_FromFormat("%U.%U",pPVar7,local_f0.m_ptr);
      pybind11::object::operator=(&local_f8,(object *)local_e8);
      pybind11::object::~object((object *)local_e8);
      pybind11::object::~object(&local_b0);
    }
    hVar2.m_ptr = (rec->scope).m_ptr;
    local_110.m_ptr = (PyObject *)0x0;
    if (hVar2.m_ptr != (PyObject *)0x0) {
      bVar4 = hasattr(hVar2,"__module__");
      if (bVar4) {
        local_c8._8_8_ = (rec->scope).m_ptr;
        local_c8._16_8_ = "__module__";
        local_b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
        accessor::operator_cast_to_object((accessor *)local_e8);
LAB_00120805:
        pybind11::object::operator=((object *)&local_110,(object *)local_e8);
        pybind11::object::~object((object *)local_e8);
        pybind11::object::~object(&local_b0);
      }
      else {
        bVar4 = hasattr((rec->scope).m_ptr,"__name__");
        if (bVar4) {
          local_c8._8_8_ = (rec->scope).m_ptr;
          local_c8._16_8_ = "__name__";
          local_b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          accessor::operator_cast_to_object((accessor *)local_e8);
          goto LAB_00120805;
        }
      }
      if (local_110.m_ptr != (PyObject *)0x0) {
        str::str((str *)&local_88,(object *)&local_110);
        cast<std::__cxx11::string>(&local_a8,(pybind11 *)&local_88,object);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,&local_a8,".");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_e8,rec->name);
        std::__cxx11::string::~string((string *)local_e8);
        std::__cxx11::string::~string((string *)&local_a8);
        pybind11::object::~object((object *)&local_88);
        goto LAB_001208b2;
      }
    }
  }
  std::__cxx11::string::string((string *)local_c8,rec->name,(allocator *)local_e8);
LAB_001208b2:
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (void *)0x0;
  }
  else {
    sVar8 = strlen(rec->doc);
    __dest = (void *)PyObject_Malloc(sVar8 + 1);
    memcpy(__dest,rec->doc,sVar8 + 1);
  }
  piVar9 = get_internals();
  tuple::tuple((tuple *)&local_108,&(rec->bases).super_object);
  lVar10 = PyTuple_Size(local_108.m_ptr);
  if (lVar10 == 0) {
    pPVar7 = piVar9->instance_base;
  }
  else {
    local_e8._8_8_ = local_108.m_ptr;
    local_e8._16_8_ = 0;
    local_e8._24_8_ = 0;
    pPVar7 = accessor<pybind11::detail::accessor_policies::tuple_item>::ptr
                       ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_e8);
    pybind11::object::~object((object *)(local_e8 + 0x18));
  }
  pPVar11 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar11 == (PyTypeObject *)0x0) {
    pPVar11 = piVar9->default_metaclass;
  }
  value.m_ptr = (*pPVar11->tp_alloc)(pPVar11,0);
  hVar2.m_ptr = local_f0.m_ptr;
  oVar3.super_handle.m_ptr = local_f8.super_handle.m_ptr;
  if (value.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&local_a8,rec->name,(allocator *)&local_88);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   &local_a8,": Unable to create type object!");
    pybind11_fail((string *)local_e8);
  }
  local_f0.m_ptr = (PyObject *)0x0;
  value.m_ptr[0x35].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
  local_f8.super_handle.m_ptr = (handle)(PyObject *)0x0;
  value.m_ptr[0x36].ob_refcnt = (Py_ssize_t)oVar3.super_handle.m_ptr;
  pPVar11 = (PyTypeObject *)strdup((char *)local_c8._0_8_);
  value.m_ptr[1].ob_type = pPVar11;
  value.m_ptr[0xb].ob_refcnt = (Py_ssize_t)__dest;
  if (pPVar7 != (PyObject *)0x0) {
    pPVar7->ob_refcnt = pPVar7->ob_refcnt + 1;
  }
  value.m_ptr[0x10].ob_refcnt = (Py_ssize_t)pPVar7;
  value.m_ptr[2].ob_refcnt = 0x38;
  lVar10 = PyTuple_Size(local_108.m_ptr);
  hVar2.m_ptr = local_108.m_ptr;
  if (lVar10 != 0) {
    local_108.m_ptr = (PyObject *)0x0;
    value.m_ptr[0x15].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
  }
  value.m_ptr[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  value.m_ptr[6].ob_refcnt = (Py_ssize_t)&value.m_ptr[0x1b].ob_type;
  value.m_ptr[6].ob_type = (PyTypeObject *)(value.m_ptr + 0x2f);
  value.m_ptr[7].ob_refcnt = (Py_ssize_t)&value.m_ptr[0x2d].ob_type;
  pbVar1 = (byte *)((long)&value.m_ptr[10].ob_type + 1);
  *pbVar1 = *pbVar1 | 6;
  bVar5 = rec->field_0x58;
  if ((bVar5 & 2) != 0) {
    enable_dynamic_attributes((PyHeapTypeObject *)value.m_ptr);
    bVar5 = rec->field_0x58;
  }
  if ((bVar5 & 4) != 0) {
    value.m_ptr[10].ob_refcnt = (Py_ssize_t)(value.m_ptr + 0x34);
    value.m_ptr[0x34].ob_refcnt = (Py_ssize_t)pybind11_getbuffer;
    value.m_ptr[0x34].ob_type = (PyTypeObject *)pybind11_releasebuffer;
  }
  iVar6 = PyType_Ready(value.m_ptr);
  if (-1 < iVar6) {
    if (((rec->field_0x58 & 2) == 0) == (((ulong)value.m_ptr[10].ob_type & 0x4000) == 0)) {
      hVar2.m_ptr = (rec->scope).m_ptr;
      if (hVar2.m_ptr != (PyObject *)0x0) {
        setattr(hVar2,rec->name,value);
      }
      if (local_110.m_ptr != (PyObject *)0x0) {
        setattr(value,"__module__",local_110);
      }
      pybind11::object::~object((object *)&local_108);
      std::__cxx11::string::~string((string *)local_c8);
      pybind11::object::~object((object *)&local_110);
      pybind11::object::~object(&local_f8);
      pybind11::object::~object((object *)&local_f0);
      return value.m_ptr;
    }
    __assert_fail("rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC) : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/class_support.h"
                  ,0x22e,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
  }
  std::__cxx11::string::string((string *)&local_48,rec->name,&local_f9);
  std::operator+(&local_88,&local_48,": PyType_Ready failed (");
  error_string_abi_cxx11_();
  std::operator+(&local_a8,&local_88,&local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 &local_a8,")!");
  pybind11_fail((string *)local_e8);
}

Assistant:

inline PyObject* make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    auto ht_qualname = name;
    if (rec.scope && hasattr(rec.scope, "__qualname__")) {
        ht_qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
    }
#endif

    object module;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__"))
            module = rec.scope.attr("__module__");
        else if (hasattr(rec.scope, "__name__"))
            module = rec.scope.attr("__name__");
    }

#if !defined(PYPY_VERSION)
    const auto full_name = module ? str(module).cast<std::string>() + "." + rec.name
                                  : std::string(rec.name);
#else
    const auto full_name = std::string(rec.name);
#endif

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (using PyObject_MALLOC, since
           Python will free this later on) */
        size_t size = strlen(rec.doc) + 1;
        tp_doc = (char *) PyObject_MALLOC(size);
        memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto base = (bases.size() == 0) ? internals.instance_base
                                    : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto metaclass = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr()
                                         : internals.default_metaclass;

    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");

    heap_type->ht_name = name.release().ptr();
#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    heap_type->ht_qualname = ht_qualname.release().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = strdup(full_name.c_str());
    type->tp_doc = tp_doc;
    type->tp_base = (PyTypeObject *) handle(base).inc_ref().ptr();
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (bases.size() > 0)
        type->tp_bases = bases.release().ptr();

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
    type->tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif

    if (rec.dynamic_attr)
        enable_dynamic_attributes(heap_type);

    if (rec.buffer_protocol)
        enable_buffer_protocol(heap_type);

    if (PyType_Ready(type) < 0)
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed (" + error_string() + ")!");

    assert(rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)
                            : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope)
        setattr(rec.scope, rec.name, (PyObject *) type);

    if (module) // Needed by pydoc
        setattr((PyObject *) type, "__module__", module);

    return (PyObject *) type;
}